

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_grouping(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_grp **groupings)

{
  lysp_node **siblings;
  lysp_node_grp *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node_grp *parent_00;
  lysp_node_grp *plVar5;
  char **ppcVar6;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar7;
  char *pcVar8;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff70;
  ly_stmt in_stack_ffffffffffffff74;
  char *local_88;
  lysp_ext_instance **local_80;
  size_t local_78;
  lysp_node_action **local_70;
  lysp_node_notif **local_68;
  char **local_60;
  char **local_58;
  uint16_t *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  char *local_38;
  
  parent_00 = (lysp_node_grp *)calloc(1,0x68);
  if (parent_00 == (lysp_node_grp *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_grouping");
  }
  else {
    plVar1 = *groupings;
    if (*groupings != (lysp_node_grp *)0x0) {
      do {
        plVar5 = plVar1;
        plVar1 = (lysp_node_grp *)(plVar5->field_0).node.next;
      } while (plVar1 != (lysp_node_grp *)0x0);
      groupings = &(plVar5->field_0).field_1.next;
    }
    *groupings = parent_00;
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_88,&local_38,&local_78);
    if (LVar3 == LY_SUCCESS) {
      if (local_38 == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar8 = local_88;
        if (local_78 == 0) {
          pcVar8 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar8,local_78,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,local_88,&(parent_00->field_0).node.name);
      }
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x4000;
        (parent_00->field_0).node.parent = parent;
        LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_78);
        if (LVar3 == LY_SUCCESS) {
          if (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_SEMICOLON) {
            if (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar8 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
              ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar8);
              return LY_EVALID;
            }
            LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_78);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            if (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE) {
              local_80 = &(parent_00->field_0).node.exts;
              local_68 = &parent_00->notifs;
              local_40 = &parent_00->groupings;
              local_70 = &parent_00->actions;
              local_48 = &parent_00->typedefs;
              siblings = &parent_00->child;
              local_50 = &(parent_00->field_0).node.flags;
              local_58 = &(parent_00->field_0).node.ref;
              local_60 = &(parent_00->field_0).node.dsc;
              do {
                if ((int)in_stack_ffffffffffffff74 < 0x2000) {
                  if ((int)in_stack_ffffffffffffff74 < 0x200) {
                    if ((int)in_stack_ffffffffffffff74 < 0x20) {
                      if (in_stack_ffffffffffffff74 == LY_STMT_NOTIFICATION) {
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar8 = "notification";
LAB_00175e75:
                          format = 
                          "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                          ;
                          goto LAB_00175ea9;
                        }
                        LVar3 = parse_notif(ctx,(lysp_node *)parent_00,local_68);
                      }
                      else {
                        if (in_stack_ffffffffffffff74 != LY_STMT_ACTION) goto LAB_00175e17;
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar8 = "action";
                          goto LAB_00175e75;
                        }
                        LVar3 = parse_action(ctx,(lysp_node *)parent_00,local_70);
                      }
                    }
                    else {
                      if (in_stack_ffffffffffffff74 == LY_STMT_ANYDATA) {
                        plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        if (*(byte *)&plVar2[2].schema < 2) {
                          plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                          pcVar8 = "anydata";
                          goto LAB_00175e75;
                        }
                      }
                      else if (in_stack_ffffffffffffff74 != LY_STMT_ANYXML) goto LAB_00175e17;
                      LVar3 = parse_any(ctx,in_stack_ffffffffffffff74,(lysp_node *)parent_00,
                                        siblings);
                    }
                  }
                  else if ((int)in_stack_ffffffffffffff74 < 0x800) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_CHOICE) {
                      LVar3 = parse_choice(ctx,(lysp_node *)parent_00,siblings);
                    }
                    else {
                      if (in_stack_ffffffffffffff74 != LY_STMT_CONTAINER) goto LAB_00175e17;
                      LVar3 = parse_container(ctx,(lysp_node *)parent_00,siblings);
                    }
                  }
                  else if (in_stack_ffffffffffffff74 == LY_STMT_GROUPING) {
                    LVar3 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_LEAF) goto LAB_00175e17;
                    LVar3 = parse_leaf(ctx,(lysp_node *)parent_00,siblings);
                  }
                }
                else if ((int)in_stack_ffffffffffffff74 < 0xf0000) {
                  if ((int)in_stack_ffffffffffffff74 < 0x8000) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_LEAF_LIST) {
                      LVar3 = parse_leaflist(ctx,(lysp_node *)parent_00,siblings);
                    }
                    else {
                      if (in_stack_ffffffffffffff74 != LY_STMT_LIST) goto LAB_00175e17;
                      LVar3 = parse_list(ctx,(lysp_node *)parent_00,siblings);
                    }
                  }
                  else if (in_stack_ffffffffffffff74 == LY_STMT_USES) {
                    LVar3 = parse_uses(ctx,(lysp_node *)parent_00,siblings);
                  }
                  else {
                    if (in_stack_ffffffffffffff74 != LY_STMT_DESCRIPTION) goto LAB_00175e17;
                    pcVar8 = *local_60;
                    parent_stmt = LY_STMT_DESCRIPTION;
                    ppcVar6 = local_60;
LAB_00175c67:
                    LVar3 = parse_text_field(ctx,pcVar8,parent_stmt,(uint32_t)ppcVar6,(char **)0x2,
                                             Y_IDENTIF_ARG,(uint16_t *)local_80,
                                             (lysp_ext_instance **)
                                             CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70));
                  }
                }
                else if ((int)in_stack_ffffffffffffff74 < 0x2c0000) {
                  if (in_stack_ffffffffffffff74 != LY_STMT_EXTENSION_INSTANCE) {
                    if (in_stack_ffffffffffffff74 == LY_STMT_REFERENCE) {
                      pcVar8 = *local_58;
                      parent_stmt = LY_STMT_REFERENCE;
                      ppcVar6 = local_58;
                      goto LAB_00175c67;
                    }
LAB_00175e17:
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar7 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar7 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar8 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_00175ea9:
                    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,"grouping");
                    return LY_EVALID;
                  }
                  LVar3 = parse_ext(ctx,local_88,local_78,parent_00,LY_STMT_GROUPING,0,local_80);
                }
                else if (in_stack_ffffffffffffff74 == LY_STMT_STATUS) {
                  LVar3 = parse_status(ctx,local_50,local_80);
                }
                else {
                  if (in_stack_ffffffffffffff74 != LY_STMT_TYPEDEF) goto LAB_00175e17;
                  LVar3 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
                }
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_78);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
              } while (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE);
              if ((*local_80 != (lysp_ext_instance *)0x0) &&
                 (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*local_80,'\x01',(uint32_t *)0x0),
                 LVar3 != LY_SUCCESS)) {
                return LVar3;
              }
            }
          }
          if (parent == (lysp_node *)0x0) {
            LVar3 = LY_SUCCESS;
          }
          else {
            if (ctx->main_ctx == (lysp_ctx *)0x0) {
              __assert_fail("ctx->main_ctx",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                            ,0xc6a,
                            "LY_ERR parse_grouping(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_node_grp **)"
                           );
            }
            LVar4 = ly_set_add(&ctx->main_ctx->grps_nodes,parent,'\0',(uint32_t *)0x0);
            LVar3 = LVar4 + (LVar4 == LY_SUCCESS);
            if (LVar4 == LY_SUCCESS) {
              LVar3 = LY_SUCCESS;
            }
          }
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_grouping(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_grp **groupings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_grp *grp;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), groupings, grp, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, grp->name, word, word_len, ret, cleanup);
    grp->nodetype = LYS_GROUPING;
    grp->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, grp->dsc, LY_STMT_DESCRIPTION, 0, &grp->dsc, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, grp->ref, LY_STMT_REFERENCE, 0, &grp->ref, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &grp->flags, &grp->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "grouping");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, &grp->node, &grp->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, &grp->node, &grp->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, &grp->node, &grp->typedefs));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "grouping");
            LY_CHECK_RET(parse_action(ctx, &grp->node, &grp->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, &grp->node, &grp->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "grouping");
            LY_CHECK_RET(parse_notif(ctx, &grp->node, &grp->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, grp, LY_STMT_GROUPING, 0, &grp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "grouping");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, grp->exts, ret, cleanup);
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->grps_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}